

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::convert
          (mipmapped_texture *this,pixel_format fmt,bool cook,pack_params *p)

{
  bool bVar1;
  pixel_format pVar2;
  uint uVar3;
  component_flags cVar4;
  vector<crnlib::mip_level_*> *pvVar5;
  mip_level **ppmVar6;
  mip_level *pmVar7;
  ulong uVar8;
  void *in_RCX;
  byte in_DL;
  pixel_format in_ESI;
  mipmapped_texture *in_RDI;
  pack_params tmp_params;
  uint progress_range;
  uint num_pixels;
  uint l_1;
  uint f_1;
  uint progress_start;
  uint l;
  uint f;
  uint total_pixels;
  uint in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  uint uVar9;
  uint in_stack_ffffffffffffff74;
  undefined1 local_78 [40];
  uint local_50;
  uint local_4c;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  void *local_20;
  byte local_15;
  pixel_format local_14;
  bool local_1;
  
  local_15 = in_DL & 1;
  local_20 = in_RCX;
  local_14 = in_ESI;
  bVar1 = is_valid((mipmapped_texture *)0x16e278);
  if (bVar1) {
    pVar2 = get_format(in_RDI);
    if (local_14 == pVar2) {
      local_1 = true;
    }
    else {
      local_24 = 0;
      for (local_28 = 0; uVar9 = local_28,
          uVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::size(&in_RDI->m_faces),
          uVar9 < uVar3; local_28 = local_28 + 1) {
        local_2c = 0;
        while( true ) {
          in_stack_ffffffffffffff74 = local_2c;
          pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                             (&in_RDI->m_faces,local_28);
          uVar3 = vector<crnlib::mip_level_*>::size(pvVar5);
          if (uVar3 <= in_stack_ffffffffffffff74) break;
          pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                             (&in_RDI->m_faces,local_28);
          ppmVar6 = vector<crnlib::mip_level_*>::operator[](pvVar5,local_2c);
          uVar3 = mip_level::get_total_pixels(*ppmVar6);
          local_24 = uVar3 + local_24;
          local_2c = local_2c + 1;
        }
      }
      local_30 = *(uint *)((long)local_20 + 0x28);
      local_34 = 0;
      while (uVar9 = local_34,
            uVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::size(&in_RDI->m_faces),
            uVar9 < uVar3) {
        local_38 = 0;
        while( true ) {
          in_stack_ffffffffffffff6c = local_38;
          pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                             (&in_RDI->m_faces,local_34);
          uVar3 = vector<crnlib::mip_level_*>::size(pvVar5);
          if (uVar3 <= in_stack_ffffffffffffff6c) break;
          pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                             (&in_RDI->m_faces,local_34);
          ppmVar6 = vector<crnlib::mip_level_*>::operator[](pvVar5,local_38);
          local_3c = mip_level::get_total_pixels(*ppmVar6);
          local_40 = (local_3c * *(int *)((long)local_20 + 0x2c)) / local_24;
          memcpy(local_78,local_20,0x38);
          local_50 = math::clamp<unsigned_int>(local_30,0,*(uint *)((long)local_20 + 0x2c));
          local_4c = math::clamp<unsigned_int>
                               (local_40,0,*(int *)((long)local_20 + 0x2c) - local_50);
          local_30 = local_4c + local_30;
          pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                             (&in_RDI->m_faces,local_34);
          vector<crnlib::mip_level_*>::operator[](pvVar5,local_38);
          bVar1 = mip_level::convert(_progress_range,tmp_params.m_pTask_pool._4_4_,
                                     tmp_params.m_pTask_pool._3_1_,(pack_params *)tmp_params._40_8_)
          ;
          if (!bVar1) {
            clear((mipmapped_texture *)CONCAT44(in_stack_ffffffffffffff74,uVar9));
            return false;
          }
          local_38 = local_38 + 1;
        }
        local_34 = local_34 + 1;
      }
      pmVar7 = get_level((mipmapped_texture *)CONCAT44(in_stack_ffffffffffffff74,uVar9),
                         in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      pVar2 = mip_level::get_format(pmVar7);
      in_RDI->m_format = pVar2;
      pmVar7 = get_level((mipmapped_texture *)CONCAT44(in_stack_ffffffffffffff74,uVar9),
                         in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      cVar4 = mip_level::get_comp_flags(pmVar7);
      in_RDI->m_comp_flags = cVar4;
      if ((*(long *)((long)local_20 + 0x18) == 0) ||
         (uVar8 = (**(code **)((long)local_20 + 0x18))
                            (*(int *)((long)local_20 + 0x28) + *(int *)((long)local_20 + 0x2c),
                             *(undefined8 *)((long)local_20 + 0x20)), (uVar8 & 1) != 0)) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool mipmapped_texture::convert(pixel_format fmt, bool cook, const dxt_image::pack_params& p) {
  if (!is_valid())
    return false;

  if (fmt == get_format())
    return true;

  uint total_pixels = 0;
  for (uint f = 0; f < m_faces.size(); f++)
    for (uint l = 0; l < m_faces[f].size(); l++)
      total_pixels += m_faces[f][l]->get_total_pixels();

  uint progress_start = p.m_progress_start;

  for (uint f = 0; f < m_faces.size(); f++) {
    for (uint l = 0; l < m_faces[f].size(); l++) {
      const uint num_pixels = m_faces[f][l]->get_total_pixels();

      uint progress_range = (num_pixels * p.m_progress_range) / total_pixels;

      dxt_image::pack_params tmp_params(p);
      tmp_params.m_progress_start = math::clamp<uint>(progress_start, 0, p.m_progress_range);
      tmp_params.m_progress_range = math::clamp<uint>(progress_range, 0, p.m_progress_range - tmp_params.m_progress_start);

      progress_start += tmp_params.m_progress_range;

      if (!m_faces[f][l]->convert(fmt, cook, tmp_params)) {
        clear();
        return false;
      }
    }
  }

  m_format = get_level(0, 0)->get_format();
  m_comp_flags = get_level(0, 0)->get_comp_flags();

  CRNLIB_ASSERT(check());

  if (p.m_pProgress_callback) {
    if (!p.m_pProgress_callback(p.m_progress_start + p.m_progress_range, p.m_pProgress_callback_user_data_ptr))
      return false;
  }

  return true;
}